

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

float __thiscall Granulator::Grain::Scan(Grain *this)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int local_2c;
  float s;
  int i;
  float amp;
  float p;
  float *src;
  Grain *this_local;
  
  pfVar3 = this->sample->data;
  iVar2 = this->channel;
  fVar5 = FastMax(0.0,this->pos);
  this->pos = this->speed + this->pos;
  fVar6 = FastClip((1.0 - ABS((fVar5 + fVar5) - 1.0)) * this->shape,0.0,1.0);
  fVar5 = fVar5 * (float)this->length + this->offset;
  local_2c = FastFloor(fVar5);
  fVar7 = (float)local_2c;
  if (this->sample->numsamples <= local_2c) {
    if (this->wrapping == 0) {
      return 0.0;
    }
    local_2c = local_2c - this->sample->numsamples;
  }
  iVar4 = local_2c + 1;
  fVar1 = pfVar3[(long)iVar2 + (long)(this->sample->numchannels * local_2c)];
  local_2c = iVar4;
  if (this->sample->numsamples <= iVar4) {
    if (this->wrapping == 0) {
      return fVar1 * fVar6;
    }
    local_2c = iVar4 - this->sample->numsamples;
  }
  return fVar6 * ((pfVar3[(long)iVar2 + (long)(this->sample->numchannels * local_2c)] - fVar1) *
                  (fVar5 - fVar7) + fVar1);
}

Assistant:

inline float Scan()
        {
            const float* src = sample->data + channel;
            float p = FastMax(0.0f, pos);
            pos += speed;
            float amp = 1.0f - fabsf(p + p - 1.0f);
            amp = FastClip(amp * shape, 0.0f, 1.0f);
            p = offset + p * length;
            int i = FastFloor(p);
            p -= i;
            if (i >= sample->numsamples)
            {
                if (!wrapping)
                    return 0.0f;
                i -= sample->numsamples;
            }
            float s = src[sample->numchannels * i++];
            if (i >= sample->numsamples)
            {
                if (!wrapping)
                    return s * amp;
                i -= sample->numsamples;
            }
            return amp * (s + (src[sample->numchannels * i] - s) * p);
        }